

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O3

bool ImPlot::BeginDragDropTargetEx(int id,ImRect *rect)

{
  bool bVar1;
  ImGuiID id_00;
  
  id_00 = ImGuiWindow::GetID(GImGui->CurrentWindow,id);
  bVar1 = ImGui::ItemAdd(rect,id_00,rect,0);
  if ((bVar1) && (bVar1 = ImGui::BeginDragDropTarget(), bVar1)) {
    return true;
  }
  return false;
}

Assistant:

bool BeginDragDropTargetEx(int id, const ImRect& rect) {
    ImGuiContext& G  = *GImGui;
    const ImGuiID ID = G.CurrentWindow->GetID(id);
    if (ImGui::ItemAdd(rect, ID, &rect) &&
        ImGui::BeginDragDropTarget())
        return true;
    return false;
}